

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

int GetLatestDataMT(MT *pMT,MTDATA *pMTData)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_868;
  double local_860;
  double local_850;
  double yaw;
  double pitch;
  double roll;
  uInt_MT ul;
  int iStack_82c;
  uShort_MT us;
  int offset;
  int nbdatabytes;
  uchar databuf [2048];
  MTDATA *pMTData_local;
  MT *pMT_local;
  
  iStack_82c = 0;
  ul.v = 0;
  pitch = 0.0;
  yaw = 0.0;
  local_850 = 0.0;
  if (pMT->bLegacyMode == 0) {
    pMT_local._4_4_ = GetLatestData2MT(pMT,pMTData);
  }
  else {
    memset(&offset,0,0x800);
    iStack_82c = 0;
    iVar1 = GetLatestMTMessageMT(pMT,0xff,0x32,(uchar *)&offset,0x800,&stack0xfffffffffffff7d4);
    if (iVar1 == 0) {
      memset(pMTData,0,0x130);
      if ((pMT->OutputMode & 0x4000U) != 0) {
        ul.v = ul.v + 0x14;
      }
      if ((pMT->OutputMode & 0x1000U) != 0) {
        ul.v = ul.v + 0x2c;
      }
      if ((pMT->OutputMode & 1U) != 0) {
        ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->temp);
      }
      if ((pMT->OutputMode & 2U) != 0) {
        if ((pMT->OutputSettings & 0x10U) == 0) {
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->accX);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->accY);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->accZ);
        }
        if ((pMT->OutputSettings & 0x20U) == 0) {
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->gyrX);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->gyrY);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->gyrZ);
        }
        if ((pMT->OutputSettings & 0x40U) == 0) {
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->magX);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->magY);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->magZ);
        }
      }
      if ((pMT->OutputMode & 4U) != 0) {
        uVar2 = pMT->OutputSettings & 0xc;
        if (uVar2 == 4) {
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->roll);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->pitch);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->yaw);
          pitch = (pMTData->roll * 3.141592653589793) / 180.0;
          yaw = (pMTData->pitch * 3.141592653589793) / 180.0;
          local_850 = (pMTData->yaw * 3.141592653589793) / 180.0;
        }
        else if (uVar2 == 8) {
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->a);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->b);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->c);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->d);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->e);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->f);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->g);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->h);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->i);
          pitch = atan2(pMTData->f,pMTData->i);
          if (-1.0 < pMTData->c || pMTData->c == -1.0) {
            if (pMTData->c <= 1.0) {
              local_868 = pMTData->c;
            }
            else {
              local_868 = 1.0;
            }
            local_860 = local_868;
          }
          else {
            local_860 = -1.0;
          }
          dVar5 = asin(local_860);
          yaw = -dVar5;
          local_850 = atan2(pMTData->b,pMTData->a);
          pMTData->roll = (pitch * 180.0) / 3.141592653589793;
          pMTData->pitch = (yaw * 180.0) / 3.141592653589793;
          pMTData->yaw = (local_850 * 180.0) / 3.141592653589793;
        }
        else {
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->q0);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->q1);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->q2);
          ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->q3);
          quaternion2euler(pMTData->q0,pMTData->q1,pMTData->q2,pMTData->q3,&pitch,&yaw,&local_850);
          pMTData->roll = (pitch * 180.0) / 3.141592653589793;
          pMTData->pitch = (yaw * 180.0) / 3.141592653589793;
          pMTData->yaw = (local_850 * 180.0) / 3.141592653589793;
        }
        dVar3 = pitch + pMT->rollorientation;
        dVar5 = pMT->rollp1;
        dVar4 = cos(pitch + pMT->rollp2);
        dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
        pMTData->Roll = dVar5;
        dVar3 = yaw + pMT->pitchorientation;
        dVar5 = pMT->pitchp1;
        dVar4 = cos(yaw + pMT->pitchp2);
        dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
        pMTData->Pitch = dVar5;
        dVar3 = local_850 + pMT->yaworientation;
        dVar5 = pMT->yawp1;
        dVar4 = cos(local_850 + pMT->yawp2);
        dVar5 = fmod_2PI(dVar5 * dVar4 + dVar3);
        pMTData->Yaw = dVar5;
      }
      if ((pMT->OutputMode & 8U) != 0) {
        if ((pMT->OutputSettings & 0x400U) == 0) {
          roll._6_2_ = CONCAT11(*(undefined1 *)((long)&offset + (long)(int)ul.v),
                                *(undefined1 *)((long)&offset + (long)(int)(ul.v + 1)));
          pMTData->Ain_1 = roll._6_2_;
          ul.v = ul.v + 2;
        }
        if ((pMT->OutputSettings & 0x800U) == 0) {
          roll._6_2_ = CONCAT11(*(undefined1 *)((long)&offset + (long)(int)ul.v),
                                *(undefined1 *)((long)&offset + (long)(int)(ul.v + 1)));
          pMTData->Ain_2 = roll._6_2_;
          ul.v = ul.v + 2;
        }
      }
      if ((pMT->OutputMode & 0x10U) != 0) {
        ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->Lat);
        ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->Long);
        ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->Alt);
      }
      if ((pMT->OutputMode & 0x20U) != 0) {
        ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->Vel_X);
        ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->Vel_Y);
        ul.v = ConvertToDoubleMT(pMT->OutputSettings,(uchar *)&offset,ul.v,&pMTData->Vel_Z);
      }
      if ((pMT->OutputMode & 0x800U) != 0) {
        pMTData->Status = *(uchar *)((long)&offset + (long)(int)ul.v);
        ul.v = ul.v + 1;
      }
      if ((pMT->OutputSettings & 1U) != 0) {
        roll._6_2_ = CONCAT11(*(undefined1 *)((long)&offset + (long)(int)ul.v),
                              *(undefined1 *)((long)&offset + (long)(int)(ul.v + 1)));
        pMTData->TS = roll._6_2_;
        ul.v = ul.v + 2;
      }
      if ((pMT->OutputSettings & 2U) != 0) {
        roll._0_4_ = CONCAT13(*(undefined1 *)((long)&offset + (long)(int)ul.v),
                              CONCAT12(*(undefined1 *)((long)&offset + (long)(int)(ul.v + 1)),
                                       CONCAT11(*(undefined1 *)
                                                 ((long)&offset + (long)(int)(ul.v + 2)),
                                                *(undefined1 *)
                                                 ((long)&offset + (long)(int)(ul.v + 3)))));
        (pMTData->UTCTime).Nanoseconds = roll._0_4_;
        roll._6_2_ = CONCAT11(*(undefined1 *)((long)&offset + (long)(int)(ul.v + 4)),
                              *(undefined1 *)((long)&offset + (long)(int)(ul.v + 5)));
        (pMTData->UTCTime).Year = roll._6_2_;
        (pMTData->UTCTime).Month = *(uchar *)((long)&offset + (long)(int)(ul.v + 6));
        (pMTData->UTCTime).Day = *(uchar *)((long)&offset + (long)(int)(ul.v + 7));
        (pMTData->UTCTime).Hour = *(uchar *)((long)&offset + (long)(int)(ul.v + 8));
        (pMTData->UTCTime).Minute = *(uchar *)((long)&offset + (long)(int)(ul.v + 9));
        (pMTData->UTCTime).Seconds = *(uchar *)((long)&offset + (long)(int)(ul.v + 10));
        (pMTData->UTCTime).Valid = *(uchar *)((long)&offset + (long)(int)(ul.v + 0xb));
        ul.v = ul.v + 0xc;
      }
      memcpy(&pMT->LastMTData,pMTData,0x130);
      pMT_local._4_4_ = 0;
    }
    else {
      pMT_local._4_4_ = 1;
    }
  }
  return pMT_local._4_4_;
}

Assistant:

inline int GetLatestDataMT(MT* pMT, MTDATA* pMTData)
{
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	int offset = 0;
	uShort_MT us;
	uInt_MT ul;
	double roll = 0, pitch = 0, yaw = 0;

	// Warning : coordinate system might not be the same between legacy and normal modes!

	if (!pMT->bLegacyMode) return GetLatestData2MT(pMT, pMTData);

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, MTDATA_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	memset(pMTData, 0, sizeof(MTDATA));

	if (pMT->OutputMode & RAW_BIT)
	{
		// Un-calibrated RAW inertial data output mode.
		offset += 20;
	}

	if (pMT->OutputMode & GPS_PVT_BIT)
	{
		// GPS PVT data output mode.
		offset += 44;
	}

	if (pMT->OutputMode & TEMPERATURE_BIT)
	{
		// Temperature data output mode.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->temp);
	}

	if (pMT->OutputMode & CALIBRATED_BIT)
	{
		// Calibrated data output mode.
		if ((pMT->OutputSettings & ACCELERATION) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->accZ);
		}
		if ((pMT->OutputSettings & RATE_OF_TURN) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->gyrZ);
		}
		if ((pMT->OutputSettings & MAGNETOMETER) == 0)
		{
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magX);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magY);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->magZ);
		}
	}

	if (pMT->OutputMode & ORIENTATION_BIT)
	{
		switch (pMT->OutputSettings & ORIENTATION_MODE_MASK)
		{
		case EULER_ANGLES:
			// Orientation data output mode - Euler angles.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->roll);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->pitch);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->yaw);
			roll = pMTData->roll*M_PI/180.0;
			pitch = pMTData->pitch*M_PI/180.0;
			yaw = pMTData->yaw*M_PI/180.0;
			break;
		case MATRIX:
			// Orientation data output mode - Matrix.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->a);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->b);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->c);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->d);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->e);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->f);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->g);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->h);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->i);
			roll = atan2(pMTData->f,pMTData->i);
			pitch = -asin(constrain(pMTData->c, -1, 1)); // Attempt to avoid potential NAN...
			yaw = atan2(pMTData->b,pMTData->a);
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;
			break;
		default:
			// Orientation data output mode - Quaternion.
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q0);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q1);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q2);
			offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->q3);
			quaternion2euler(pMTData->q0, pMTData->q1, pMTData->q2, pMTData->q3, &roll, &pitch, &yaw);
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;
			break;
		}

		// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
		pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
		pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
		pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
	}

	if (pMT->OutputMode & AUXILIARY_BIT)
	{
		// Auxiliary data output mode.
		if ((pMT->OutputSettings & ANALOG_1) == 0)
		{
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_1 = us.v;
			offset += 2;
		}
		if ((pMT->OutputSettings & ANALOG_2) == 0)
		{
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_2 = us.v;
			offset += 2;
		}
	}

	if (pMT->OutputMode & POSITION_BIT)
	{
		// Position data output mode - LLA.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Lat);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Long);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Alt);
	}

	if (pMT->OutputMode & VELOCITY_BIT)
	{
		// Velocity data output mode - VelXYZ.
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_X);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_Y);
		offset = ConvertToDoubleMT(pMT->OutputSettings, databuf, offset, &pMTData->Vel_Z);
	}

	if (pMT->OutputMode & STATUS_BIT)
	{
		// Status (1 byte).
		pMTData->Status = databuf[offset];
		offset += 1;
	}

	if (pMT->OutputSettings & SAMPLE_COUNTER)
	{
		// Sample counter (2 bytes).
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		pMTData->TS = us.v;
		offset += 2;
	}

	if (pMT->OutputSettings & UTC_TIME)
	{
		// UTC Time (12 bytes).
		ul.c[0] = databuf[3+offset];
		ul.c[1] = databuf[2+offset];
		ul.c[2] = databuf[1+offset];
		ul.c[3] = databuf[0+offset];
		pMTData->UTCTime.Nanoseconds = ul.v;
		offset += 4;
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		pMTData->UTCTime.Year = us.v;
		offset += 2;
		pMTData->UTCTime.Month = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Day = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Hour = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Minute = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Seconds = databuf[offset];
		offset += 1;
		pMTData->UTCTime.Valid = databuf[offset];
		offset += 1;
	}

	pMT->LastMTData = *pMTData;

	return EXIT_SUCCESS;
}